

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

void __thiscall
ProString::ProString<ProString&,char_const(&)[9]>
          (ProString *this,QStringBuilder<ProString_&,_const_char_(&)[9]> *str)

{
  long lVar1;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<ProString_&,_const_char_(&)[9]> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffffb8);
  ProString(in_RDI,(QString *)in_stack_ffffffffffffffb8);
  QString::~QString((QString *)0x1b8647);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}